

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

void SetupFilterStrength(VP8Encoder *enc)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long *in_RDI;
  int f;
  int base_strength;
  int qstep;
  VP8SegmentInfo *m;
  int level0;
  int i;
  int local_2c;
  int local_28;
  int local_c;
  
  iVar1 = *(int *)(*in_RDI + 0x20);
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    lVar3 = (long)local_c * 0x2e8;
    iVar2 = clip((int)in_RDI[(long)local_c * 0x5d + 0xa1],0,0x7f);
    iVar2 = VP8FilterStrengthFromDelta((int)in_RDI[3],(int)(uint)kAcTable[iVar2] >> 2);
    local_2c = (iVar2 * iVar1 * 5) / (*(int *)((long)in_RDI + lVar3 + 0x504) + 0x100);
    if (local_2c < 2) {
      local_28 = 0;
    }
    else {
      if (0x3f < local_2c) {
        local_2c = 0x3f;
      }
      local_28 = local_2c;
    }
    *(int *)((long)in_RDI + lVar3 + 0x50c) = local_28;
  }
  *(undefined4 *)((long)in_RDI + 0x14) = *(undefined4 *)((long)in_RDI + 0x50c);
  *(uint *)(in_RDI + 2) = (uint)(*(int *)(*in_RDI + 0x28) == 0);
  *(undefined4 *)(in_RDI + 3) = *(undefined4 *)(*in_RDI + 0x24);
  return;
}

Assistant:

static void SetupFilterStrength(VP8Encoder* const enc) {
  int i;
  // level0 is in [0..500]. Using '-f 50' as filter_strength is mid-filtering.
  const int level0 = 5 * enc->config->filter_strength;
  for (i = 0; i < NUM_MB_SEGMENTS; ++i) {
    VP8SegmentInfo* const m = &enc->dqm[i];
    // We focus on the quantization of AC coeffs.
    const int qstep = kAcTable[clip(m->quant, 0, 127)] >> 2;
    const int base_strength =
        VP8FilterStrengthFromDelta(enc->filter_hdr.sharpness, qstep);
    // Segments with lower complexity ('beta') will be less filtered.
    const int f = base_strength * level0 / (256 + m->beta);
    m->fstrength = (f < FSTRENGTH_CUTOFF) ? 0 : (f > 63) ? 63 : f;
  }
  // We record the initial strength (mainly for the case of 1-segment only).
  enc->filter_hdr.level = enc->dqm[0].fstrength;
  enc->filter_hdr.simple = (enc->config->filter_type == 0);
  enc->filter_hdr.sharpness = enc->config->filter_sharpness;
}